

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckIndent.cxx
# Opt level: O1

bool __thiscall kws::Parser::InitIndentation(Parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer pcVar3;
  string *psVar4;
  string *psVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  size_t sVar12;
  int iVar13;
  uint uVar14;
  pointer ppVar15;
  ulong uVar16;
  char cVar17;
  vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_> *this_00;
  _Alloc_hider _Var18;
  size_t *psVar19;
  ulong uVar20;
  byte bVar21;
  pointer __args;
  string *psVar22;
  bool bVar23;
  IndentPosition ind;
  vector<unsigned_long,_std::allocator<unsigned_long>_> namespacevec;
  size_t posNamespaceComments;
  vector<unsigned_long,_std::allocator<unsigned_long>_> namespacePos;
  IndentPosition tempind;
  IndentPosition tempind_1;
  value_type local_2a0;
  ulong local_270;
  size_t *local_268;
  iterator iStack_260;
  unsigned_long *local_258;
  value_type local_248;
  size_t *local_218;
  iterator iStack_210;
  unsigned_long *local_208;
  value_type local_1f8;
  string *local_1c8;
  string local_1c0;
  value_type local_1a0;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = &this->m_IdentPositionVector;
  std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::clear(this_00)
  ;
  local_268 = (size_t *)0x0;
  iStack_260._M_current = (size_t *)0x0;
  local_258 = (unsigned_long *)0x0;
  psVar22 = &this->m_BufferNoComment;
  for (uVar6 = std::__cxx11::string::find((char *)psVar22,0x178529,0); uVar6 != 0xffffffffffffffff;
      uVar6 = std::__cxx11::string::find((char *)psVar22,0x178529,uVar6 + 1)) {
    uVar7 = std::__cxx11::string::find((char *)psVar22,0x16acee,uVar6);
    if ((uVar7 != 0xffffffffffffffff) &&
       (uVar8 = std::__cxx11::string::find((char *)psVar22,0x177d56,uVar6), uVar7 < uVar8)) {
      local_2a0.position = GetPositionWithComments(this,uVar7);
      local_2a0.name._M_dataplus._M_p = (pointer)&local_2a0.name.field_2;
      local_2a0.name._M_string_length = 0;
      local_2a0.name.field_2._M_local_buf[0] = '\0';
      local_2a0.current = 0;
      local_2a0.after = 0;
      local_248.position = local_2a0.position;
      if (iStack_260._M_current == local_258) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_268,iStack_260,
                   &local_248.position);
      }
      else {
        *iStack_260._M_current = local_2a0.position;
        iStack_260._M_current = iStack_260._M_current + 1;
      }
      std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::push_back
                (this_00,&local_2a0);
      sVar9 = local_248.position;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
      local_2a0.position = FindClosingChar(this,'{','}',sVar9,false,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (iStack_260._M_current == local_258) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_268,iStack_260,
                   &local_2a0.position);
      }
      else {
        *iStack_260._M_current = local_2a0.position;
        iStack_260._M_current = iStack_260._M_current + 1;
      }
      std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::push_back
                (this_00,&local_2a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0.name._M_dataplus._M_p != &local_2a0.name.field_2) {
        operator_delete(local_2a0.name._M_dataplus._M_p);
      }
    }
  }
  local_218 = (size_t *)0x0;
  iStack_210._M_current = (size_t *)0x0;
  local_208 = (unsigned_long *)0x0;
  __args = (this->m_IdentPositionVector).
           super__Vector_base<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (__args != (this->m_IdentPositionVector).
                super__Vector_base<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (iStack_210._M_current == local_208) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_218,iStack_210,
                   &__args->position);
      }
      else {
        *iStack_210._M_current = __args->position;
        iStack_210._M_current = iStack_210._M_current + 1;
      }
      __args = __args + 1;
    } while (__args != (this->m_IdentPositionVector).
                       super__Vector_base<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  do {
    uVar6 = std::__cxx11::string::find((char)psVar22,0x7b);
    psVar5 = psVar22;
    psVar4 = local_1c8;
    if (uVar6 == 0xffffffffffffffff) break;
    sVar9 = GetPositionWithComments(this,uVar6);
    for (ppVar15 = (this->m_IfElseEndifList).
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        (bVar23 = ppVar15 !=
                  (this->m_IfElseEndifList).
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish, bVar23 &&
        ((sVar9 <= ppVar15->first || (ppVar15->second <= sVar9)))); ppVar15 = ppVar15 + 1) {
    }
    psVar4 = local_1c8;
  } while (bVar23);
  while (local_1c8 = psVar5, cVar17 = (char)psVar22, uVar6 != 0xffffffffffffffff) {
    uVar8 = std::__cxx11::string::find(cVar17,0x7b);
    uVar7 = local_270 >> 0x20;
    local_270 = uVar7 << 0x20;
    if (uVar8 < uVar6) {
      local_270 = uVar7 << 0x20;
      do {
        sVar9 = GetPositionWithComments(this,uVar8);
        for (ppVar15 = (this->m_IfElseEndifList).
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            (bVar23 = ppVar15 !=
                      (this->m_IfElseEndifList).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish, bVar23 &&
            ((sVar9 <= ppVar15->first || (ppVar15->second <= sVar9)))); ppVar15 = ppVar15 + 1) {
        }
        if (bVar23) {
          bVar23 = false;
        }
        else {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
          bVar23 = IsBetweenQuote(this,uVar8,false,&local_90);
          bVar23 = !bVar23;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
        }
        if (bVar23) {
          if (local_218 == iStack_210._M_current) {
            uVar14 = 1;
          }
          else {
            bVar21 = 0;
            psVar19 = local_218;
            do {
              sVar9 = *psVar19;
              sVar10 = GetPositionWithComments(this,uVar8);
              if (sVar9 == sVar10) {
                bVar21 = 1;
              }
              psVar19 = psVar19 + 1;
            } while (psVar19 != iStack_210._M_current);
            uVar14 = (uint)(~bVar21 & 1);
            psVar22 = local_1c8;
          }
          local_270 = CONCAT44(local_270._4_4_,(int)local_270 + uVar14);
        }
        uVar8 = std::__cxx11::string::find((char)psVar22,0x7b);
      } while (uVar8 < uVar6);
    }
    iVar13 = 0;
    uVar7 = std::__cxx11::string::find((char)psVar22,0x7d);
    if (uVar7 < uVar6) {
      iVar13 = 0;
      do {
        sVar9 = GetPositionWithComments(this,uVar7);
        for (ppVar15 = (this->m_IfElseEndifList).
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            (bVar23 = ppVar15 !=
                      (this->m_IfElseEndifList).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish, bVar23 &&
            ((sVar9 <= ppVar15->first || (ppVar15->second <= sVar9)))); ppVar15 = ppVar15 + 1) {
        }
        if (bVar23) {
          bVar23 = false;
        }
        else {
          local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"");
          bVar23 = IsBetweenQuote(this,uVar7,false,&local_1c0);
          bVar23 = !bVar23;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            operator_delete(local_1c0._M_dataplus._M_p);
          }
        }
        if (bVar23) {
          if (local_218 == iStack_210._M_current) {
            uVar14 = 1;
          }
          else {
            bVar21 = 0;
            psVar19 = local_218;
            do {
              sVar9 = *psVar19;
              sVar10 = GetPositionWithComments(this,uVar7);
              if (sVar9 == sVar10) {
                bVar21 = 1;
              }
              psVar19 = psVar19 + 1;
            } while (psVar19 != iStack_210._M_current);
            uVar14 = (uint)(~bVar21 & 1);
            psVar22 = local_1c8;
          }
          iVar13 = iVar13 + uVar14;
        }
        uVar7 = std::__cxx11::string::find((char)psVar22,0x7d);
      } while (uVar7 < uVar6);
    }
    psVar19 = local_268;
    if (iVar13 == (int)local_270) {
      for (; (bVar23 = psVar19 != iStack_260._M_current, bVar23 &&
             (sVar9 = *psVar19, sVar10 = GetPositionWithComments(this,uVar6), sVar9 != sVar10));
          psVar19 = psVar19 + 1) {
      }
    }
    else {
      bVar23 = false;
    }
    psVar22 = local_1c8;
    if ((iVar13 == (int)local_270) && (!bVar23)) {
      sVar9 = GetPositionWithComments(this,uVar6);
      paVar1 = &local_2a0.name.field_2;
      local_2a0.name._M_string_length = 0;
      local_2a0.name.field_2._M_local_buf[0] = '\0';
      local_2a0.current = 0;
      local_2a0.after = 1;
      local_2a0.position = sVar9;
      local_2a0.name._M_dataplus._M_p = (pointer)paVar1;
      std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::push_back
                (this_00,&local_2a0);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
      local_2a0.position = FindClosingChar(this,'{','}',sVar9,false,&local_b0);
      psVar4 = &local_b0;
      _Var18._M_p = local_b0._M_dataplus._M_p;
      while( true ) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var18._M_p != &psVar4->field_2) {
          operator_delete(_Var18._M_p);
        }
        sVar9 = local_2a0.position;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
        bVar23 = IsBetweenQuote(this,sVar9,true,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        sVar9 = local_2a0.position;
        if (!bVar23) break;
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
        local_2a0.position = FindClosingChar(this,'{','}',sVar9 + 1,false,&local_f0);
        psVar4 = &local_f0;
        _Var18._M_p = local_f0._M_dataplus._M_p;
      }
      local_2a0.current = -1;
      local_2a0.after = -1;
      std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::push_back
                (this_00,&local_2a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_2a0.name._M_dataplus._M_p);
      }
    }
    uVar6 = std::__cxx11::string::find((char)psVar22,0x7b);
    psVar5 = local_1c8;
    psVar4 = local_1c8;
  }
  local_1c8 = psVar4;
  for (lVar11 = std::__cxx11::string::find((char *)psVar22,0x178533,0); lVar11 != -1;
      lVar11 = std::__cxx11::string::find((char *)psVar22,0x178533,lVar11 + 4)) {
    uVar6 = lVar11 + 5;
    uVar7 = (this->m_BufferNoComment)._M_string_length;
    uVar8 = uVar6;
    if (uVar6 < uVar7) {
      do {
        uVar20 = (ulong)(byte)(psVar22->_M_dataplus)._M_p[uVar6];
        uVar8 = uVar6;
        if ((0x20 < uVar20) || ((0x100002400U >> (uVar20 & 0x3f) & 1) == 0)) break;
        uVar6 = uVar6 + 1;
        uVar8 = uVar7;
      } while (uVar7 != uVar6);
    }
    if (((psVar22->_M_dataplus)._M_p[uVar8] == '(') &&
       (sVar9 = std::__cxx11::string::find(cVar17,0x7b), sVar9 != 0xffffffffffffffff)) {
      sVar9 = GetPositionWithComments(this,sVar9);
      local_2a0.name._M_dataplus._M_p = (pointer)&local_2a0.name.field_2;
      local_2a0.name._M_string_length = 0;
      local_2a0.name.field_2._M_local_buf[0] = '\0';
      local_2a0.current = 0;
      local_2a0.after = 1;
      local_2a0.position = sVar9;
      std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::push_back
                (this_00,&local_2a0);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
      local_2a0.position = FindClosingChar(this,'{','}',sVar9,false,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      local_2a0.current = -1;
      local_2a0.after = -1;
      std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::push_back
                (this_00,&local_2a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0.name._M_dataplus._M_p != &local_2a0.name.field_2) {
        operator_delete(local_2a0.name._M_dataplus._M_p);
      }
    }
  }
  uVar6 = std::__cxx11::string::find((char *)psVar22,0x178538,0);
  do {
    while( true ) {
      if (uVar6 == 0xffffffffffffffff) {
        AddIndent(this,"public:",-1,0);
        AddIndent(this,"private:",-1,0);
        AddIndent(this,"protected:",-1,0);
        AddIndent(this,"signals:",-1,0);
        AddIndent(this,"public slots:",-1,0);
        AddIndent(this,"private slots:",-1,0);
        AddIndent(this,"protected slots:",-1,0);
        AddIndent(this,"#include",-99999,0);
        AddIndent(this,"#if",-99999,0);
        AddIndent(this,"#elif",-99999,0);
        AddIndent(this,"#else",-99999,0);
        AddIndent(this,"#endif",-99999,0);
        AddIndent(this,"#define",-99999,0);
        AddIndent(this,"#undef",-99999,0);
        if (local_218 != (size_t *)0x0) {
          operator_delete(local_218);
        }
        if (local_268 != (size_t *)0x0) {
          operator_delete(local_268);
        }
        return true;
      }
      uVar14 = (int)uVar6 - 1;
      pcVar3 = (psVar22->_M_dataplus)._M_p;
      cVar2 = pcVar3[uVar14];
      if (((cVar2 == '\n') || (uVar14 == 0 || cVar2 == ' ')) &&
         ((uVar7 = (ulong)((int)uVar6 + 6), (this->m_BufferNoComment)._M_string_length <= uVar7 ||
          ((pcVar3[uVar7] & 0xf7U) == 0x20)))) break;
      uVar6 = std::__cxx11::string::find((char *)psVar22,0x178538,uVar6 + 1);
    }
    local_270 = uVar6;
    sVar9 = std::__cxx11::string::find((char *)psVar22,0x16acee,uVar6);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    sVar10 = FindClosingChar(this,'{','}',sVar9,true,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_2a0.position = GetPositionWithComments(this,sVar10);
    local_2a0.name._M_dataplus._M_p = (pointer)&local_2a0.name.field_2;
    local_2a0.name._M_string_length = 0;
    local_2a0.name.field_2._M_local_buf[0] = '\0';
    local_2a0.current = -1;
    local_2a0.after = -2;
    std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::push_back
              (this_00,&local_2a0);
    uVar6 = std::__cxx11::string::find((char *)psVar22,0x17853f,sVar9);
    if (sVar10 < uVar6) {
      uVar6 = 0xffffffffffffffff;
    }
    for (uVar7 = std::__cxx11::string::find((char *)psVar22,0x178538,local_270 + 1);
        uVar7 != 0xffffffffffffffff;
        uVar7 = std::__cxx11::string::find((char *)psVar22,0x178538,uVar7 + 1)) {
      uVar14 = (int)uVar7 - 1;
      pcVar3 = (psVar22->_M_dataplus)._M_p;
      cVar2 = pcVar3[uVar14];
      if (((cVar2 == '\n') || (uVar14 == 0 || cVar2 == ' ')) &&
         ((uVar8 = (ulong)((int)uVar7 + 6), (this->m_BufferNoComment)._M_string_length <= uVar8 ||
          ((pcVar3[uVar8] & 0xf7U) == 0x20)))) {
        if (uVar6 <= uVar7) break;
        uVar6 = std::__cxx11::string::find((char *)psVar22,0x17853f,uVar6 + 1);
      }
    }
    if (uVar6 != 0xffffffffffffffff) {
      local_248.position = GetPositionWithComments(this,uVar6);
      local_248.name._M_dataplus._M_p = (pointer)&local_248.name.field_2;
      local_248.name._M_string_length = 0;
      local_248.name.field_2._M_local_buf[0] = '\0';
      sVar12 = uVar6 - 1;
      if (uVar6 != 0) {
        do {
          uVar7 = (ulong)(byte)(psVar22->_M_dataplus)._M_p[sVar12];
          if ((0x20 < uVar7) || ((0x100002400U >> (uVar7 & 0x3f) & 1) == 0)) goto LAB_001510bd;
          bVar23 = sVar12 != 0;
          sVar12 = sVar12 - 1;
        } while (bVar23);
        sVar12 = 0xffffffffffffffff;
      }
LAB_001510bd:
      if (sVar12 == sVar9) {
        local_248.current = 0;
      }
      else {
        local_248.current = -1;
      }
      local_248.after = 0;
      std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::push_back
                (this_00,&local_248);
      sVar12 = std::__cxx11::string::find((char *)psVar22,0x178e53,uVar6 + 1);
      sVar12 = GetPositionWithComments(this,sVar12);
      uVar6 = (this->m_Buffer)._M_string_length;
      uVar8 = sVar12 + 1;
      uVar7 = uVar8;
      if (uVar8 < uVar6) {
        do {
          uVar20 = (ulong)(byte)(this->m_Buffer)._M_dataplus._M_p[uVar8];
          uVar7 = uVar8;
          if ((0x20 < uVar20) || ((0x100002400U >> (uVar20 & 0x3f) & 1) == 0)) break;
          uVar8 = uVar8 + 1;
          uVar7 = uVar6;
        } while (uVar6 != uVar8);
      }
      if ((this->m_Buffer)._M_dataplus._M_p[uVar7] == '{') {
        local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
        local_1f8.name._M_string_length = 0;
        local_1f8.name.field_2._M_local_buf[0] = '\0';
        local_1f8.current = 0;
        local_1f8.after = 0;
        local_1f8.position = uVar7;
        std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
        push_back(this_00,&local_1f8);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
        local_1f8.position = FindClosingChar(this,'{','}',uVar7,false,&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        local_1f8.current = 0;
        local_1f8.after = 0;
        std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
        push_back(this_00,&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
          operator_delete(local_1f8.name._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248.name._M_dataplus._M_p != &local_248.name.field_2) {
        operator_delete(local_248.name._M_dataplus._M_p);
      }
    }
    uVar6 = std::__cxx11::string::find((char *)psVar22,0x178547,sVar9);
    if (uVar6 < sVar10) {
      bVar23 = true;
      sVar12 = sVar9;
      do {
        uVar7 = std::__cxx11::string::find((char *)psVar22,0x178538,sVar12);
        if (uVar7 < uVar6 && sVar9 < uVar7) {
          sVar12 = std::__cxx11::string::find((char *)psVar22,0x16acee,uVar7);
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
          sVar12 = FindClosingChar(this,'{','}',sVar12,true,&local_150);
          psVar4 = &local_150;
          _Var18._M_p = local_150._M_dataplus._M_p;
        }
        else {
          local_248.position = GetPositionWithComments(this,uVar6);
          local_248.name._M_dataplus._M_p = (pointer)&local_248.name.field_2;
          local_248.name._M_string_length = 0;
          local_248.name.field_2._M_local_buf[0] = '\0';
          if (bVar23) {
            local_248.current = 0;
          }
          else {
            local_248.current = -1;
          }
          local_248.after = 0;
          std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
          push_back(this_00,&local_248);
          do {
            sVar12 = std::__cxx11::string::find(cVar17,0x3a);
            if ((this->m_BufferNoComment)._M_string_length <= sVar12 + 1) break;
          } while ((psVar22->_M_dataplus)._M_p[sVar12 + 1] == ':');
          if (sVar12 != 0xffffffffffffffff) {
            sVar12 = GetPositionWithComments(this,sVar12);
            local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
            local_1f8.name._M_string_length = 0;
            local_1f8.name.field_2._M_local_buf[0] = '\0';
            if (bVar23) {
              local_1f8.current = 0;
              local_1f8.after = 1;
            }
            else {
              local_1f8.current = -1;
              local_1f8.after = 0;
            }
            local_1f8.position = sVar12;
            std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
            push_back(this_00,&local_1f8);
            uVar7 = (this->m_Buffer)._M_string_length;
            uVar20 = sVar12 + 1;
            uVar8 = uVar20;
            if (uVar20 < uVar7) {
              do {
                uVar16 = (ulong)(byte)(this->m_Buffer)._M_dataplus._M_p[uVar20];
                uVar8 = uVar20;
                if ((0x20 < uVar16) || ((0x100002400U >> (uVar16 & 0x3f) & 1) == 0)) break;
                uVar20 = uVar20 + 1;
                uVar8 = uVar7;
              } while (uVar7 != uVar20);
            }
            if ((this->m_Buffer)._M_dataplus._M_p[uVar8] == '{') {
              local_1a0.name._M_dataplus._M_p = (pointer)&local_1a0.name.field_2;
              local_1a0.name._M_string_length = 0;
              local_1a0.name.field_2._M_local_buf[0] = '\0';
              local_1a0.current = 0;
              local_1a0.after = 0;
              local_1a0.position = uVar8;
              std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
              push_back(this_00,&local_1a0);
              local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"");
              local_1a0.position = FindClosingChar(this,'{','}',uVar8,false,&local_170);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170._M_dataplus._M_p != &local_170.field_2) {
                operator_delete(local_170._M_dataplus._M_p);
              }
              local_1a0.current = 0;
              local_1a0.after = 0;
              std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
              push_back(this_00,&local_1a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0.name._M_dataplus._M_p != &local_1a0.name.field_2) {
                operator_delete(local_1a0.name._M_dataplus._M_p);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
              operator_delete(local_1f8.name._M_dataplus._M_p);
            }
          }
          psVar4 = &local_248.name;
          _Var18._M_p = local_248.name._M_dataplus._M_p;
          sVar12 = uVar6;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var18._M_p != &psVar4->field_2) {
          operator_delete(_Var18._M_p);
        }
        uVar6 = std::__cxx11::string::find((char *)psVar22,0x178547,sVar12 + 1);
        bVar23 = false;
      } while (uVar6 < sVar10);
    }
    uVar6 = std::__cxx11::string::find((char *)psVar22,0x178538,local_270 + 3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0.name._M_dataplus._M_p != &local_2a0.name.field_2) {
      operator_delete(local_2a0.name._M_dataplus._M_p);
    }
  } while( true );
}

Assistant:

bool Parser::InitIndentation()
{
  m_IdentPositionVector.clear();

  // namespace
  std::vector<size_t> namespacevec;

  size_t posNamespace = m_BufferNoComment.find("namespace",0);
  while(posNamespace!=std::string::npos)
    {
    size_t posNamespace1 = m_BufferNoComment.find("{",posNamespace);
    if(posNamespace1 != std::string::npos)
      {
      size_t posNamespace2 = m_BufferNoComment.find(";",posNamespace);
      if((posNamespace2 == std::string::npos) || (posNamespace2 > posNamespace1))
        {
        size_t posNamespaceComments = this->GetPositionWithComments(posNamespace1);
        IndentPosition ind;
        ind.position = posNamespaceComments;
        ind.current = 0;
        ind.after = 0;
        namespacevec.push_back(posNamespaceComments);
        //std::cout << "Found Namespace at: " << this->GetLineNumber(posNamespaceComments) << std::endl;
        m_IdentPositionVector.push_back(ind);
        ind.position = this->FindClosingChar('{','}',posNamespaceComments);
        namespacevec.push_back(ind.position);
        m_IdentPositionVector.push_back(ind);
        }
      }
    posNamespace = m_BufferNoComment.find("namespace",posNamespace+1);
    }

  // Create a list of position specific for namespaces
  std::vector<size_t> namespacePos;
  auto itIdentPos = m_IdentPositionVector.begin();
  while(itIdentPos != m_IdentPositionVector.end())
    {
    namespacePos.push_back((*itIdentPos).position);
    itIdentPos++;
    }

  // Check if the { is the first in the file/function or in a namespace
  size_t posClass = m_BufferNoComment.find('{',0);

  while(posClass!= std::string::npos && this->IsInElseForbiddenSection(this->GetPositionWithComments(posClass)))
    {
    posClass = m_BufferNoComment.find('{',posClass+1);
    }

  while(posClass != std::string::npos)
    {
    // We count the number of { and } before posClass
    unsigned int nOpen = 0;
    unsigned int nClose = 0;

    size_t open = m_BufferNoComment.find('{',0);
    while(open!=std::string::npos && open<posClass)
      {
      if(!this->IsInElseForbiddenSection(this->GetPositionWithComments(open))
        && !this->IsBetweenQuote(open)
        )
        {
        bool isNamespace = false;
        // Remove the potential namespaces
        std::vector<size_t>::const_iterator itN = namespacePos.begin();
        while(itN != namespacePos.end())
          {
          if((*itN)==this->GetPositionWithComments(open))
            {
            isNamespace = true;
            }
          itN++;
          }
        if(!isNamespace)
          {
          nOpen++;
          }
        }
      open = m_BufferNoComment.find('{',open+1);
      }

    size_t close = m_BufferNoComment.find('}',0);
    while(close!=std::string::npos && close<posClass)
      {
      if(!this->IsInElseForbiddenSection(this->GetPositionWithComments(close))
        && !this->IsBetweenQuote(close)
        )
        {
        bool isNamespace = false;
        // Remove the potential namespaces
        std::vector<size_t>::const_iterator itN = namespacePos.begin();
        while(itN != namespacePos.end())
          {
          if((*itN)==this->GetPositionWithComments(close))
            {
            isNamespace = true;
            }
          itN++;
          }
        if(!isNamespace)
          {
          nClose++;
          }
        }
      close = m_BufferNoComment.find('}',close+1);
      }

    bool defined = false;

    if(nClose == nOpen)
      {
      // Check if this is not the namespace previously defined
      auto itname = namespacevec.begin();
      while(itname != namespacevec.end())
        {
        if((*itname) == this->GetPositionWithComments(posClass))
          {
          defined = true;
          break;
          }
        itname++;
        }
      }

    if((nClose == nOpen) && !defined)
      {
      // translate the position in the buffer position;
      size_t posClassComments = this->GetPositionWithComments(posClass);
      IndentPosition ind;
      ind.position = posClassComments;
      ind.current = 0;
      ind.after = 1;
      m_IdentPositionVector.push_back(ind);
      ind.position = this->FindClosingChar('{','}',posClassComments);
      while(this->IsBetweenQuote(ind.position,true))
        {
        ind.position = this->FindClosingChar('{','}',ind.position+1);
        }
      ind.current = -1;
      ind.after = -1;
      m_IdentPositionVector.push_back(ind);
      }
    posClass = m_BufferNoComment.find('{',posClass+1);
    }

  // int main()
  size_t posMain = m_BufferNoComment.find("main",0);
  while(posMain != std::string::npos)
    {
    // Check if the next char is '('
    bool valid = true;
    auto pos = static_cast<unsigned long>(posMain + 5);
    while(pos<m_BufferNoComment.size()
         && (m_BufferNoComment[pos]==' '
         || m_BufferNoComment[pos]=='\r'
         || m_BufferNoComment[pos]=='\n')
         )
      {
      pos++;
      }

    if(m_BufferNoComment[pos]!='(')
      {
      valid = false;
      }
    if(valid)
      {
      size_t bracket = m_BufferNoComment.find('{',posMain+4);
      if(bracket != std::string::npos)
        {
        // translate the position in the buffer position;
        size_t posMainComments = this->GetPositionWithComments(bracket);
        IndentPosition ind;
        ind.position = posMainComments;
        ind.current = 0;
        ind.after = 1;
        m_IdentPositionVector.push_back(ind);
        ind.position = this->FindClosingChar('{','}',posMainComments);
        ind.current = -1;
        ind.after = -1;
        m_IdentPositionVector.push_back(ind);
        }
      }
    posMain = m_BufferNoComment.find("main",posMain+4);
    }

  // switch/case statement
  // for the moment break; restore the indentation
  size_t posSwitch = m_BufferNoComment.find("switch",0);
  while(posSwitch != std::string::npos)
    {
    // Check that it is a valid switch statement
    if(!this->CheckValidSwitchStatement(static_cast<unsigned int>(posSwitch)))
     {
     posSwitch = m_BufferNoComment.find("switch",posSwitch+1);
     continue;
     }

    // If this is the first case we find the openning { in order to
    // find the closing } of the switch statement
    size_t openningBracket = m_BufferNoComment.find("{",posSwitch);
    size_t closingBracket = this->FindClosingChar('{','}',openningBracket,true);
    size_t posColumnComments = this->GetPositionWithComments(closingBracket);
    IndentPosition ind;
    ind.position = posColumnComments;
    ind.current = -1;
    ind.after = -2;
    m_IdentPositionVector.push_back(ind);

    // Do the default case
    size_t defaultPos = m_BufferNoComment.find("default",openningBracket);
    if(defaultPos > closingBracket)
      {
      defaultPos = std::string::npos;
      }

    // We need to make sure that there is no "switch" statement nested
    size_t nestedSwitch = m_BufferNoComment.find("switch",posSwitch+1);
    while(nestedSwitch != std::string::npos)
      {
        if(!this->CheckValidSwitchStatement(static_cast<unsigned int>(nestedSwitch)))
        {
        nestedSwitch = m_BufferNoComment.find("switch",nestedSwitch+1);
        continue;
        }

      if(nestedSwitch < defaultPos)
        {
        defaultPos = m_BufferNoComment.find("default",defaultPos+1);
        }
      else
        {
        break;
        }
      nestedSwitch = m_BufferNoComment.find("switch",nestedSwitch+1);
      }

    if(defaultPos != std::string::npos)
      {
      size_t localposColumnComments = this->GetPositionWithComments(defaultPos);
      IndentPosition localind;
      localind.position = localposColumnComments;

      // The current indent should be -1 unless we are right after the openning
      // bracket. In that case the current indent should be 0;
      size_t j=defaultPos-1;
      while(j!=std::string::npos)
        {
        if(m_BufferNoComment[j] != ' '
          && m_BufferNoComment[j] != '\n'
          && m_BufferNoComment[j] != '\r'
          )
          {
          break;
          }
        j--;
        }

      if(j == openningBracket)
        {
        localind.current = 0;
        }
      else
        {
        localind.current = -1;
        }

      localind.after = 0;
      m_IdentPositionVector.push_back(localind);
      // Find the ':' after the default
      size_t column = m_BufferNoComment.find(":",defaultPos+1);
      column = this->GetPositionWithComments(column);

      // Sometimes there is a { right after the : we skip it if this is
      // the case
      size_t ic = column+1;
      while(ic<m_Buffer.size()
            && (m_Buffer[ic] == ' '
            || m_Buffer[ic] == '\r'
            || m_Buffer[ic] == '\n'))
        {
        ic++;
        }
      if(m_Buffer[ic] == '{')
        {
        IndentPosition tempind;
        tempind.position = ic;
        tempind.current = 0;
        tempind.after = 0;
        m_IdentPositionVector.push_back(tempind);
        tempind.position = this->FindClosingChar('{','}',ic);
        tempind.current = 0;
        tempind.after = 0;
        m_IdentPositionVector.push_back(tempind);
        }
      }

    size_t posCase = m_BufferNoComment.find("case",openningBracket);
    bool firstCase = true;
    size_t previousCase = openningBracket;

    while(posCase!= std::string::npos && posCase<closingBracket)
      {
      // Check if we don't have any switch statement inside
      size_t insideSwitch = m_BufferNoComment.find("switch",previousCase);
      if(insideSwitch>openningBracket && insideSwitch<posCase)
        {
        // jump to the end of the inside switch/case
        size_t insideBracket = m_BufferNoComment.find("{",insideSwitch);
        posCase = this->FindClosingChar('{','}',insideBracket,true);
        }
      else
        {
        size_t localposColumnComments = this->GetPositionWithComments(posCase);
        IndentPosition localindtemp;
        localindtemp.position = localposColumnComments;
        if(firstCase)
          {
          localindtemp.current = 0;
          }
        else
          {
          localindtemp.current = -1;
          }
        localindtemp.after = 0;

        m_IdentPositionVector.push_back(localindtemp);

        size_t column = m_BufferNoComment.find(':',posCase+3);
        // Make sure that we are not checing '::'
        while(column+1<m_BufferNoComment.size()
          && m_BufferNoComment[column+1]==':')
          {
          column = m_BufferNoComment.find(':',column+2);
          }

        if(column != std::string::npos)
          {
          // translate the position in the buffer position;
          localposColumnComments = this->GetPositionWithComments(column);
          IndentPosition localind;
          localind.position = localposColumnComments;
          if(firstCase)
            {
            localind.current = 0;
            localind.after = 1;
            }
          else
            {
            localind.current = -1;
            localind.after = 0;
            }
          m_IdentPositionVector.push_back(localind);

          // Sometimes there is a { right after the : we skip it if this is
          // the case
          size_t ic = localposColumnComments+1;
          while(ic<m_Buffer.size()
            && (m_Buffer[ic] == ' '
            || m_Buffer[ic] == '\r'
            || m_Buffer[ic] == '\n'))
            {
            ic++;
            }
          if(m_Buffer[ic] == '{')
            {
            IndentPosition tempind;
            tempind.position = ic;
            tempind.current = 0;
            tempind.after = 0;
            m_IdentPositionVector.push_back(tempind);
            tempind.position = this->FindClosingChar('{','}',ic);
            tempind.current = 0;
            tempind.after = 0;
            m_IdentPositionVector.push_back(tempind);
            }
          }
        }
      firstCase = false;
      previousCase = posCase;
      posCase = m_BufferNoComment.find("case",posCase+1);
      }

    posSwitch = m_BufferNoComment.find("switch",posSwitch+3);
    }

  // Some words should be indented as the previous indent
  this->AddIndent("public:",-1,0);
  this->AddIndent("private:",-1,0);
  this->AddIndent("protected:",-1,0);
  this->AddIndent("signals:",-1,0);
  this->AddIndent("public slots:",-1,0);
  this->AddIndent("private slots:",-1,0);
  this->AddIndent("protected slots:",-1,0);

  // some words should be always align left
  this->AddIndent("#include",ALIGN_LEFT,0);
  this->AddIndent("#if",ALIGN_LEFT,0);
  //this->AddIndent("#ifdef",ALIGN_LEFT,0); // #if is taking care of it
  this->AddIndent("#elif",ALIGN_LEFT,0);
  this->AddIndent("#else",ALIGN_LEFT,0);
  this->AddIndent("#endif",ALIGN_LEFT,0);
  //this->AddIndent("#ifndef",ALIGN_LEFT,0); // #if is taking care of it
  this->AddIndent("#define",ALIGN_LEFT,0);
  this->AddIndent("#undef",ALIGN_LEFT,0);

  return true;
}